

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

void __thiscall
unodb::detail::
db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::operator()(db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *this,olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                   *inode_ptr)

{
  qsbr_per_thread *this_00;
  debug_callback local_38;
  
  this_00 = qsbr_per_thread::get_instance();
  local_38.super__Function_base._M_functor._8_8_ = 0;
  local_38.super__Function_base._M_functor._M_unused._M_object = olc_node_header::check_on_dealloc;
  local_38._M_invoker =
       std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::_M_invoke;
  local_38.super__Function_base._M_manager =
       std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::_M_manager;
  qsbr_per_thread::on_next_epoch_deallocate(this_00,inode_ptr,0x828,&local_38);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
  ::
  decrement_inode_count<unodb::detail::olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
            ((olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              *)(this->
                super_db_inode_qsbr_deleter_parent<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::detail::olc_inode_256<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
                ).db);
  return;
}

Assistant:

void operator()(INode* inode_ptr) {
    static_assert(std::is_trivially_destructible_v<INode>);

    this_thread().on_next_epoch_deallocate(inode_ptr
#ifdef UNODB_DETAIL_WITH_STATS
                                           ,
                                           sizeof(INode)
#endif
#ifndef NDEBUG
                                               ,
                                           olc_node_header::check_on_dealloc
#endif
    );

#ifdef UNODB_DETAIL_WITH_STATS
    this->get_db().template decrement_inode_count<INode>();
#endif  // UNODB_DETAIL_WITH_STATS
  }